

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_schnorrsig.cpp
# Opt level: O3

SchnorrSignature *
cfd::core::SchnorrUtil::Sign
          (SchnorrSignature *__return_storage_ptr__,ByteData256 *msg,Privkey *sk,
          ByteData256 *aux_rand)

{
  ByteData local_38;
  
  ByteData256::GetData(&local_38,aux_rand);
  SignCommon(__return_storage_ptr__,msg,sk,(secp256k1_nonce_function_hardened *)0x0,&local_38);
  if (local_38.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_38.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

SchnorrSignature SchnorrUtil::Sign(
    const ByteData256 &msg, const Privkey &sk, const ByteData256 &aux_rand) {
  return SignCommon(msg, sk, nullptr, aux_rand.GetData());
}